

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O1

Am_Value * __thiscall Am_Value::operator=(Am_Value *this,Am_Wrapper *in_value)

{
  uint *puVar1;
  Am_Wrapper *pAVar2;
  Am_Value_Type AVar3;
  int iVar4;
  
  if (((short)this->type < 0) && (pAVar2 = (this->value).wrapper_value, pAVar2 != (Am_Wrapper *)0x0)
     ) {
    puVar1 = &pAVar2->refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar2->super_Am_Registered_Type)._vptr_Am_Registered_Type[4])();
    }
  }
  (this->value).wrapper_value = in_value;
  if (in_value == (Am_Wrapper *)0x0) {
    AVar3 = 0xa000;
  }
  else {
    iVar4 = (**(in_value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(in_value);
    AVar3 = (Am_Value_Type)iVar4;
  }
  this->type = AVar3;
  return this;
}

Assistant:

Am_Value &
Am_Value::operator=(Am_Wrapper *in_value)
{
  if (Am_Type_Is_Ref_Counted(type) && value.wrapper_value)
    value.wrapper_value->Release();
  value.wrapper_value = in_value;
  if (in_value)
    type = in_value->ID();
  else
    type = Am_WRAPPER_TYPE;
  return *this;
}